

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

string * __thiscall
MinVR::VRDatumFloat::getValueString_abi_cxx11_(string *__return_storage_ptr__,VRDatumFloat *this)

{
  char buffer [20];
  allocator<char> local_29;
  char local_28 [24];
  
  sprintf(local_28,"%f",
          (double)*(float *)&(this->super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>).value.
                             super__List_base<float,_std::allocator<float>_>._M_impl._M_node.
                             super__List_node_base._M_next[1]._M_next);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string VRDatumFloat::getValueString() const {
  char buffer[20];
  sprintf(buffer, "%f", value.front());
  return std::string(buffer);
}